

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char  [7] __thiscall kj::str<char_const(&)[83]>(kj *this,char (*params) [83])

{
  char (*value) [83];
  ArrayPtr<const_char> local_28;
  char (*local_18) [83];
  char (*params_local) [83];
  
  local_18 = params;
  params_local = (char (*) [83])this;
  value = ::const(params);
  local_28 = toCharSequence<char_const(&)[83]>(value);
  _::concat<kj::ArrayPtr<char_const>>
            ((String *)this,(_ *)&local_28,(ArrayPtr<const_char> *)local_28.size_);
  return SUB87(this,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}